

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base64.hpp
# Opt level: O3

string * beast::detail::base64_decode<void>(string *__return_storage_ptr__,string *data)

{
  pair<unsigned_long,_unsigned_long> pVar1;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  std::__cxx11::string::resize
            ((ulong)__return_storage_ptr__,(char)(data->_M_string_length >> 2) * '\x03');
  pVar1 = base64::decode<void>
                    ((__return_storage_ptr__->_M_dataplus)._M_p,(data->_M_dataplus)._M_p,
                     data->_M_string_length);
  std::__cxx11::string::resize((ulong)__return_storage_ptr__,(char)pVar1.first);
  return __return_storage_ptr__;
}

Assistant:

std::string
base64_decode(std::string const& data)
{
    std::string dest;
    dest.resize(base64::decoded_size(data.size()));
    auto const result = base64::decode(
        &dest[0], data.data(), data.size());
    dest.resize(result.first);
    return dest;
}